

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int getsumalgorithm(xmlattr_list *list)

{
  xmlattr *pxVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  for (pxVar1 = list->first; pxVar1 != (xmlattr *)0x0; pxVar1 = pxVar1->next) {
    iVar3 = strcmp(pxVar1->name,"style");
    if (iVar3 == 0) {
      pbVar2 = (byte *)pxVar1->value;
      if (((((*pbVar2 | 0x20) == 0x73) && ((pbVar2[1] | 0x20) == 0x68)) &&
          ((pbVar2[2] | 0x20) == 0x61)) && ((pbVar2[3] == 0x31 && (pbVar2[4] == 0)))) {
        iVar4 = 1;
      }
      if ((((*pbVar2 | 0x20) == 0x6d) && ((pbVar2[1] | 0x20) == 100)) &&
         ((pbVar2[2] == 0x35 && (pbVar2[3] == 0)))) {
        iVar4 = 2;
      }
    }
  }
  return iVar4;
}

Assistant:

static int
getsumalgorithm(struct xmlattr_list *list)
{
	struct xmlattr *attr;
	int alg = CKSUM_NONE;

	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "style") == 0) {
			const char *v = attr->value;
			if ((v[0] == 'S' || v[0] == 's') &&
			    (v[1] == 'H' || v[1] == 'h') &&
			    (v[2] == 'A' || v[2] == 'a') &&
			    v[3] == '1' && v[4] == '\0')
				alg = CKSUM_SHA1;
			if ((v[0] == 'M' || v[0] == 'm') &&
			    (v[1] == 'D' || v[1] == 'd') &&
			    v[2] == '5' && v[3] == '\0')
				alg = CKSUM_MD5;
		}
	}
	return (alg);
}